

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::filterMember
          (TGlslangToSpvTraverser *this,TType *member)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  TIntermediate *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  const_iterator cVar3;
  bool bVar4;
  bool bVar5;
  key_type local_f0;
  key_type local_d0;
  key_type local_b0;
  key_type local_90;
  key_type local_70;
  key_type local_50;
  
  pTVar1 = this->glslangIntermediate;
  this_00 = &pTVar1->requestedExtensions;
  iVar2 = (*member->_vptr_TType[6])(member);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var,iVar2),"gl_SecondaryViewportMaskNV");
  if (iVar2 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GL_NV_stereo_view_rendering","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_50);
    bVar5 = (_Rb_tree_header *)cVar3._M_node ==
            &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar5 = false;
  }
  bVar4 = true;
  if (!bVar5) {
    iVar2 = (*member->_vptr_TType[6])(member);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      CONCAT44(extraout_var_00,iVar2),"gl_SecondaryPositionNV");
    if (iVar2 == 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"GL_NV_stereo_view_rendering","");
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&this_00->_M_t,&local_70);
      bVar5 = (_Rb_tree_header *)cVar3._M_node ==
              &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar5 = false;
    }
    if (!bVar5) {
      if (this->glslangIntermediate->language == EShLangMesh) {
        iVar2 = (*member->_vptr_TType[6])(member);
        iVar2 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_01,iVar2),"gl_PrimitiveShadingRateEXT");
        if (iVar2 == 0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"GL_EXT_fragment_shading_rate","");
          cVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&this_00->_M_t,&local_90);
          bVar5 = (_Rb_tree_header *)cVar3._M_node ==
                  &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5) {
          return true;
        }
      }
      if (this->glslangIntermediate->language != EShLangMesh) {
        iVar2 = (*member->_vptr_TType[6])(member);
        iVar2 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_02,iVar2),"gl_ViewportMask");
        if (iVar2 == 0) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"GL_NV_viewport_array2","");
          cVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&this_00->_M_t,&local_b0);
          bVar5 = (_Rb_tree_header *)cVar3._M_node ==
                  &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5) {
          return true;
        }
        iVar2 = (*member->_vptr_TType[6])(member);
        iVar2 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_03,iVar2),"gl_PositionPerViewNV");
        if (iVar2 == 0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"GL_NVX_multiview_per_view_attributes","");
          cVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&this_00->_M_t,&local_d0);
          bVar5 = (_Rb_tree_header *)cVar3._M_node ==
                  &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5) {
          return true;
        }
        iVar2 = (*member->_vptr_TType[6])(member);
        iVar2 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_04,iVar2),"gl_ViewportMaskPerViewNV");
        if (iVar2 == 0) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"GL_NVX_multiview_per_view_attributes","");
          cVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&this_00->_M_t,&local_f0);
          bVar5 = (_Rb_tree_header *)cVar3._M_node ==
                  &(pTVar1->requestedExtensions)._M_t._M_impl.super__Rb_tree_header;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5) {
          return true;
        }
      }
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool TGlslangToSpvTraverser::filterMember(const glslang::TType& member)
{
    auto& extensions = glslangIntermediate->getRequestedExtensions();

    if (member.getFieldName() == "gl_SecondaryViewportMaskNV" &&
        extensions.find("GL_NV_stereo_view_rendering") == extensions.end())
        return true;
    if (member.getFieldName() == "gl_SecondaryPositionNV" &&
        extensions.find("GL_NV_stereo_view_rendering") == extensions.end())
        return true;

    if (glslangIntermediate->getStage() == EShLangMesh) {
        if (member.getFieldName() == "gl_PrimitiveShadingRateEXT" &&
            extensions.find("GL_EXT_fragment_shading_rate") == extensions.end())
            return true;
    }

    if (glslangIntermediate->getStage() != EShLangMesh) {
        if (member.getFieldName() == "gl_ViewportMask" &&
            extensions.find("GL_NV_viewport_array2") == extensions.end())
            return true;
        if (member.getFieldName() == "gl_PositionPerViewNV" &&
            extensions.find("GL_NVX_multiview_per_view_attributes") == extensions.end())
            return true;
        if (member.getFieldName() == "gl_ViewportMaskPerViewNV" &&
            extensions.find("GL_NVX_multiview_per_view_attributes") == extensions.end())
            return true;
    }

    return false;
}